

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkTestTools.cpp
# Opt level: O3

bool test::ValidatePreconnectData(uint channel,uint8_t *data,uint bytes)

{
  ulong uVar1;
  ulong uVar2;
  
  if (channel == 0x37 && bytes == 10) {
    uVar1 = 0;
    while (uVar2 = uVar1, data[uVar2] == (&PreConnectData)[uVar2]) {
      uVar1 = uVar2 + 1;
      if (uVar2 + 1 == 10) {
        return 8 < uVar2;
      }
    }
  }
  return false;
}

Assistant:

bool ValidatePreconnectData(unsigned channel, const uint8_t* data, unsigned bytes)
{
    if (bytes != kPreConnectDataBytes || channel != kPreConnectChannel)
        return false;

    for (unsigned i = 0; i < kPreConnectDataBytes; ++i)
        if (data[i] != PreConnectData[i])
            return false;

    return true;
}